

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int ddSymmSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move *pMVar1;
  int local_34;
  Move *pMStack_30;
  int res;
  Move *move;
  int size_local;
  Move *moves_local;
  DdManager *table_local;
  
  move._4_4_ = size;
  for (pMStack_30 = moves; pMVar1 = moves, pMStack_30 != (Move *)0x0; pMStack_30 = pMStack_30->next)
  {
    if (pMStack_30->size < move._4_4_) {
      move._4_4_ = pMStack_30->size;
    }
  }
  while( true ) {
    pMStack_30 = pMVar1;
    if (pMStack_30 == (Move *)0x0) {
      return 1;
    }
    if (pMStack_30->size == move._4_4_) break;
    if ((table->subtables[pMStack_30->x].next == pMStack_30->x) &&
       (table->subtables[pMStack_30->y].next == pMStack_30->y)) {
      local_34 = cuddSwapInPlace(table,pMStack_30->x,pMStack_30->y);
    }
    else {
      local_34 = ddSymmGroupMoveBackward(table,pMStack_30->x,pMStack_30->y);
    }
    if (local_34 == 0) {
      return 0;
    }
    pMVar1 = pMStack_30->next;
  }
  return 1;
}

Assistant:

static int
ddSymmSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res = -1;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (table->subtables[move->x].next == move->x && table->subtables[move->y].next == move->y) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
#ifdef DD_DEBUG
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = ddSymmGroupMoveBackward(table,(int)move->x,(int)move->y);
        }
        if (!res) return(0);
    }

    return(1);

}